

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeField
                    (FieldDescriptor *field,Message *message,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  int *piVar1;
  uint *puVar2;
  long *plVar3;
  ulong *puVar4;
  ushort uVar5;
  char *pcVar6;
  double dVar7;
  bool bVar8;
  uint uVar9;
  int32_t iVar10;
  CppStringType CVar11;
  uint32_t uVar12;
  int iVar13;
  int iVar14;
  MapFieldBase *this;
  uint8_t *puVar15;
  RepeatedField<double> *rhs;
  int64_t iVar16;
  uint64_t uVar17;
  EnumValueDescriptor *pEVar18;
  MessageLite *pMVar19;
  string *psVar20;
  RepeatedField<int> *pRVar21;
  RepeatedField<unsigned_int> *pRVar22;
  RepeatedField<long> *pRVar23;
  size_t sVar24;
  RepeatedField<float> *rhs_00;
  RepeatedField<unsigned_long> *pRVar25;
  RepeatedField<bool> *rhs_01;
  const_pointer piVar26;
  const_pointer puVar27;
  const_pointer plVar28;
  byte *pbVar29;
  ulong uVar30;
  const_pointer data;
  const_pointer puVar31;
  ulong *puVar32;
  const_pointer data_00;
  const_pointer puVar33;
  unsigned_long uVar34;
  const_pointer data_01;
  Reflection *this_00;
  uint uVar35;
  pointer __src;
  char *in_R9;
  size_type __n;
  undefined4 uVar36;
  float value;
  undefined4 uVar37;
  Metadata MVar38;
  string_view s;
  string_view s_00;
  string_view field_name;
  anon_class_24_3_10f69874 get_message_from_field;
  vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> sorted_key_list;
  MapKey local_c0;
  MapValueConstRef local_a8;
  string *local_98;
  DescriptorPool *local_90;
  MessageFactory *local_88;
  __atomic_base<unsigned_int> local_7c;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  map_entries;
  
  MVar38 = Message::GetMetadata(message);
  this_00 = MVar38.reflection;
  if (((((field->field_0x1 & 8) != 0) &&
       ((field->containing_type_->options_->field_0)._impl_.message_set_wire_format_ == true)) &&
      (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10)) &&
     (bVar8 = FieldDescriptor::is_repeated(field), !bVar8)) {
    puVar15 = InternalSerializeMessageSetItem(field,message,target,stream);
    return puVar15;
  }
  bVar8 = FieldDescriptor::is_map(field);
  if (bVar8) {
    this = Reflection::GetMapData(this_00,message,field);
    bVar8 = MapFieldBase::IsMapValid(this);
    if (bVar8) {
      if (stream->is_serialization_deterministic_ == true) {
        MapKeySorter::SortKey(&sorted_key_list,message,this_00,field);
        for (; sorted_key_list.
               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               sorted_key_list.
               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
               ._M_impl.super__Vector_impl_data._M_finish;
            sorted_key_list.
            super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 sorted_key_list.
                 super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1) {
          map_entries.
          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          map_entries.
          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((ulong)map_entries.
                                super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
          Reflection::LookupMapValue
                    (this_00,message,field,
                     sorted_key_list.
                     super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                     ._M_impl.super__Vector_impl_data._M_start,(MapValueConstRef *)&map_entries);
          target = InternalSerializeMapEntry
                             (field,sorted_key_list.
                                    super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                              (MapValueConstRef *)&map_entries,target,stream);
        }
        std::_Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::
        ~_Vector_base(&sorted_key_list.
                       super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                     );
        return target;
      }
      Reflection::MapBegin((MapIterator *)&sorted_key_list,this_00,message,field);
      while( true ) {
        Reflection::MapEnd((MapIterator *)&map_entries,this_00,message,field);
        bVar8 = protobuf::operator!=((MapIterator *)&sorted_key_list,(MapIterator *)&map_entries);
        if (!bVar8) break;
        target = InternalSerializeMapEntry(field,&local_c0,&local_a8,target,stream);
        MapIterator::operator++((MapIterator *)&sorted_key_list);
      }
      return target;
    }
  }
  bVar8 = FieldDescriptor::is_repeated(field);
  if (bVar8) {
    uVar9 = Reflection::FieldSize(this_00,message,field);
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (((1 < (int)uVar9) && (bVar8 = FieldDescriptor::is_map(field), bVar8)) &&
       (stream->is_serialization_deterministic_ == true)) {
      DynamicMapSorter::Sort
                ((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                  *)&sorted_key_list,message,uVar9,this_00,field);
      std::
      vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ::_M_move_assign(&map_entries,
                       (_Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                        *)&sorted_key_list);
      std::
      _Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ::~_Vector_base((_Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                       *)&sorted_key_list);
    }
  }
  else {
    if ((field->containing_type_->options_->field_0)._impl_.map_entry_ == false) {
      bVar8 = Reflection::HasField(this_00,message,field);
      uVar9 = (uint)bVar8;
    }
    else {
      uVar9 = 1;
    }
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  bVar8 = FieldDescriptor::is_packed(field);
  if (!bVar8) {
    get_message_from_field.map_entries = &map_entries;
    uVar35 = 0;
    get_message_from_field.message = message;
    get_message_from_field.message_reflection = this_00;
    local_90 = (DescriptorPool *)stream;
    local_7c._M_i = uVar9;
    if ((int)uVar9 < 1) {
      local_7c._M_i = 0;
    }
    for (; uVar35 != local_7c._M_i; uVar35 = uVar35 + 1) {
      target = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      switch(field->type_) {
      case '\x01':
        bVar8 = FieldDescriptor::is_repeated(field);
        if (bVar8) {
          dVar7 = Reflection::GetRepeatedDouble(this_00,message,field,uVar35);
          uVar36 = SUB84(dVar7,0);
          uVar37 = (undefined4)((ulong)dVar7 >> 0x20);
        }
        else {
          dVar7 = Reflection::GetDouble(this_00,message,field);
          uVar36 = SUB84(dVar7,0);
          uVar37 = (undefined4)((ulong)dVar7 >> 0x20);
        }
        target = WireFormatLite::WriteDoubleToArray
                           (field->number_,(double)CONCAT44(uVar37,uVar36),target);
        break;
      case '\x02':
        bVar8 = FieldDescriptor::is_repeated(field);
        if (bVar8) {
          value = Reflection::GetRepeatedFloat(this_00,message,field,uVar35);
        }
        else {
          value = Reflection::GetFloat(this_00,message,field);
        }
        target = WireFormatLite::WriteFloatToArray(field->number_,value,target);
        break;
      case '\x03':
        bVar8 = FieldDescriptor::is_repeated(field);
        if (bVar8) {
          iVar16 = Reflection::GetRepeatedInt64(this_00,message,field,uVar35);
        }
        else {
          iVar16 = Reflection::GetInt64(this_00,message,field);
        }
        target = WireFormatLite::WriteInt64ToArray(field->number_,iVar16,target);
        break;
      case '\x04':
        bVar8 = FieldDescriptor::is_repeated(field);
        if (bVar8) {
          uVar17 = Reflection::GetRepeatedUInt64(this_00,message,field,uVar35);
        }
        else {
          uVar17 = Reflection::GetUInt64(this_00,message,field);
        }
        target = WireFormatLite::WriteUInt64ToArray(field->number_,uVar17,target);
        break;
      case '\x05':
        bVar8 = FieldDescriptor::is_repeated(field);
        if (bVar8) {
          iVar10 = Reflection::GetRepeatedInt32(this_00,message,field,uVar35);
        }
        else {
          iVar10 = Reflection::GetInt32(this_00,message,field);
        }
        target = WireFormatLite::WriteInt32ToArray(field->number_,iVar10,target);
        break;
      case '\x06':
        bVar8 = FieldDescriptor::is_repeated(field);
        if (bVar8) {
          uVar17 = Reflection::GetRepeatedUInt64(this_00,message,field,uVar35);
        }
        else {
          uVar17 = Reflection::GetUInt64(this_00,message,field);
        }
        target = WireFormatLite::WriteFixed64ToArray(field->number_,uVar17,target);
        break;
      case '\a':
        bVar8 = FieldDescriptor::is_repeated(field);
        if (bVar8) {
          uVar12 = Reflection::GetRepeatedUInt32(this_00,message,field,uVar35);
        }
        else {
          uVar12 = Reflection::GetUInt32(this_00,message,field);
        }
        target = WireFormatLite::WriteFixed32ToArray(field->number_,uVar12,target);
        break;
      case '\b':
        bVar8 = FieldDescriptor::is_repeated(field);
        if (bVar8) {
          bVar8 = Reflection::GetRepeatedBool(this_00,message,field,uVar35);
        }
        else {
          bVar8 = Reflection::GetBool(this_00,message,field);
        }
        target = WireFormatLite::WriteBoolToArray(field->number_,bVar8,target);
        break;
      case '\t':
        FieldDescriptor::requires_utf8_validation(field);
        sorted_key_list.
        super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)&sorted_key_list.
                       super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        sorted_key_list.
        super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        sorted_key_list.
        super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        bVar8 = FieldDescriptor::is_repeated(field);
        if (bVar8) {
          psVar20 = Reflection::GetRepeatedStringReference
                              (this_00,message,field,uVar35,(string *)&sorted_key_list);
        }
        else {
          psVar20 = Reflection::GetStringReference(this_00,message,field,(string *)&sorted_key_list)
          ;
        }
        pcVar6 = (field->all_names_).payload_;
        uVar5 = *(ushort *)(pcVar6 + 2);
        field_name._M_len = pcVar6 + ~(ulong)uVar5;
        field_name._M_str = in_R9;
        WireFormatLite::VerifyUtf8String
                  ((WireFormatLite *)(psVar20->_M_dataplus)._M_p,
                   (char *)(ulong)(uint)psVar20->_M_string_length,1,(uint)uVar5,field_name);
        uVar9 = field->number_;
        __n = psVar20->_M_string_length;
        if ((long)__n < 0x80) {
          local_98 = (string *)
                     (((DescriptorPool *)stream)->field_memo_table_mutex_).mu_.
                     super___atomic_base<long>._M_i;
          local_88 = (MessageFactory *)(ulong)uVar9;
          iVar14 = io::EpsCopyOutputStream::TagSize(uVar9 * 8);
          if ((long)__n <= (long)((long)&local_98->field_2 + ~(ulong)(target + iVar14))) {
            pbVar29 = target + 2;
            for (uVar9 = uVar9 * 8 | 2; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
              pbVar29[-2] = (byte)uVar9 | 0x80;
              pbVar29 = pbVar29 + 1;
            }
            pbVar29[-2] = (byte)uVar9;
            pbVar29[-1] = (byte)__n;
            __src = (psVar20->_M_dataplus)._M_p;
LAB_00cdc68c:
            memcpy(pbVar29,__src,__n);
            target = pbVar29 + __n;
            stream = (EpsCopyOutputStream *)local_90;
            goto LAB_00cdc69f;
          }
          __n = psVar20->_M_string_length;
          uVar9 = (uint)local_88;
          stream = (EpsCopyOutputStream *)local_90;
        }
        s._M_str = (psVar20->_M_dataplus)._M_p;
        s._M_len = __n;
        target = io::EpsCopyOutputStream::WriteStringOutline(stream,uVar9,s,target);
LAB_00cdc69f:
        std::__cxx11::string::~string((string *)&sorted_key_list);
        break;
      case '\n':
        pMVar19 = &InternalSerializeField::anon_class_24_3_10f69874::operator()
                             (&get_message_from_field,field,uVar35)->super_MessageLite;
        target = WireFormatLite::InternalWriteGroup(field->number_,pMVar19,target,stream);
        break;
      case '\v':
        pMVar19 = &InternalSerializeField::anon_class_24_3_10f69874::operator()
                             (&get_message_from_field,field,uVar35)->super_MessageLite;
        iVar14 = field->number_;
        iVar13 = MessageLite::GetCachedSize(pMVar19);
        target = WireFormatLite::InternalWriteMessage(iVar14,pMVar19,iVar13,target,stream);
        break;
      case '\f':
        CVar11 = FieldDescriptor::cpp_string_type(field);
        if (CVar11 != kCord) {
          sorted_key_list.
          super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)&sorted_key_list.
                         super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          sorted_key_list.
          super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          sorted_key_list.
          super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          bVar8 = FieldDescriptor::is_repeated(field);
          if (bVar8) {
            psVar20 = Reflection::GetRepeatedStringReference
                                (this_00,message,field,uVar35,(string *)&sorted_key_list);
          }
          else {
            psVar20 = Reflection::GetStringReference
                                (this_00,message,field,(string *)&sorted_key_list);
          }
          uVar9 = field->number_;
          __n = psVar20->_M_string_length;
          if ((long)__n < 0x80) {
            puVar15 = (uint8_t *)
                      (((DescriptorPool *)stream)->field_memo_table_mutex_).mu_.
                      super___atomic_base<long>._M_i;
            local_98 = psVar20;
            local_88 = (MessageFactory *)(ulong)uVar9;
            iVar14 = io::EpsCopyOutputStream::TagSize(uVar9 * 8);
            if ((long)__n <= (long)(puVar15 + ~(ulong)(target + iVar14) + 0x10)) {
              pbVar29 = target + 2;
              for (uVar9 = uVar9 * 8 | 2; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
                pbVar29[-2] = (byte)uVar9 | 0x80;
                pbVar29 = pbVar29 + 1;
              }
              pbVar29[-2] = (byte)uVar9;
              pbVar29[-1] = (byte)__n;
              __src = (local_98->_M_dataplus)._M_p;
              goto LAB_00cdc68c;
            }
            __n = local_98->_M_string_length;
            uVar9 = (uint)local_88;
            psVar20 = local_98;
            stream = (EpsCopyOutputStream *)local_90;
          }
          s_00._M_str = (psVar20->_M_dataplus)._M_p;
          s_00._M_len = __n;
          target = io::EpsCopyOutputStream::WriteStringOutline(stream,uVar9,s_00,target);
          goto LAB_00cdc69f;
        }
        Reflection::GetCord((Reflection *)&sorted_key_list,(Message *)this_00,
                            (FieldDescriptor *)message);
        target = io::EpsCopyOutputStream::WriteString
                           (stream,field->number_,(Cord *)&sorted_key_list,target);
        absl::lts_20250127::Cord::~Cord((Cord *)&sorted_key_list);
        break;
      case '\r':
        bVar8 = FieldDescriptor::is_repeated(field);
        if (bVar8) {
          uVar12 = Reflection::GetRepeatedUInt32(this_00,message,field,uVar35);
        }
        else {
          uVar12 = Reflection::GetUInt32(this_00,message,field);
        }
        target = WireFormatLite::WriteUInt32ToArray(field->number_,uVar12,target);
        break;
      case '\x0e':
        bVar8 = FieldDescriptor::is_repeated(field);
        if (bVar8) {
          pEVar18 = Reflection::GetRepeatedEnum(this_00,message,field,uVar35);
        }
        else {
          pEVar18 = Reflection::GetEnum(this_00,message,field);
        }
        target = WireFormatLite::WriteEnumToArray(field->number_,pEVar18->number_,target);
        break;
      case '\x0f':
        bVar8 = FieldDescriptor::is_repeated(field);
        if (bVar8) {
          iVar10 = Reflection::GetRepeatedInt32(this_00,message,field,uVar35);
        }
        else {
          iVar10 = Reflection::GetInt32(this_00,message,field);
        }
        target = WireFormatLite::WriteSFixed32ToArray(field->number_,iVar10,target);
        break;
      case '\x10':
        bVar8 = FieldDescriptor::is_repeated(field);
        if (bVar8) {
          iVar16 = Reflection::GetRepeatedInt64(this_00,message,field,uVar35);
        }
        else {
          iVar16 = Reflection::GetInt64(this_00,message,field);
        }
        target = WireFormatLite::WriteSFixed64ToArray(field->number_,iVar16,target);
        break;
      case '\x11':
        bVar8 = FieldDescriptor::is_repeated(field);
        if (bVar8) {
          iVar10 = Reflection::GetRepeatedInt32(this_00,message,field,uVar35);
        }
        else {
          iVar10 = Reflection::GetInt32(this_00,message,field);
        }
        target = WireFormatLite::WriteSInt32ToArray(field->number_,iVar10,target);
        break;
      case '\x12':
        bVar8 = FieldDescriptor::is_repeated(field);
        if (bVar8) {
          iVar16 = Reflection::GetRepeatedInt64(this_00,message,field,uVar35);
        }
        else {
          iVar16 = Reflection::GetInt64(this_00,message,field);
        }
        target = WireFormatLite::WriteSInt64ToArray(field->number_,iVar16,target);
      }
    }
    goto LAB_00cdd2d2;
  }
  if (uVar9 == 0) goto LAB_00cdd2d2;
  puVar15 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
  switch(field->type_) {
  case '\x01':
    rhs = Reflection::GetRepeatedFieldInternal<double>(this_00,message,field);
    RepeatedField<double>::RepeatedField((RepeatedField<double> *)&get_message_from_field,rhs);
    iVar14 = field->number_;
    puVar15 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar15);
    iVar13 = RepeatedField<double>::size((RepeatedField<double> *)&get_message_from_field);
    if (puVar15 < stream->end_) {
      puVar15 = puVar15 + 2;
      for (uVar9 = iVar14 * 8 + 2; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
        puVar15[-2] = (byte)uVar9 | 0x80;
        puVar15 = puVar15 + 1;
      }
      puVar15[-2] = (byte)uVar9;
      for (uVar9 = iVar13 << 3; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
        puVar15[-1] = (byte)uVar9 | 0x80;
        puVar15 = puVar15 + 1;
      }
      puVar15[-1] = (byte)uVar9;
      data_01 = RepeatedField<double>::data((RepeatedField<double> *)&get_message_from_field);
      target = io::EpsCopyOutputStream::WriteRaw(stream,data_01,iVar13 << 3,puVar15);
      RepeatedField<double>::~RepeatedField((RepeatedField<double> *)&get_message_from_field);
      goto LAB_00cdd2d2;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&sorted_key_list,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
               ,0x355,"ptr < end_");
    goto LAB_00cdd4bf;
  case '\x02':
    rhs_00 = Reflection::GetRepeatedFieldInternal<float>(this_00,message,field);
    RepeatedField<float>::RepeatedField((RepeatedField<float> *)&get_message_from_field,rhs_00);
    iVar14 = field->number_;
    puVar15 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar15);
    iVar13 = RepeatedField<float>::size((RepeatedField<float> *)&get_message_from_field);
    if (puVar15 < stream->end_) {
      puVar15 = puVar15 + 2;
      for (uVar9 = iVar14 * 8 + 2; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
        puVar15[-2] = (byte)uVar9 | 0x80;
        puVar15 = puVar15 + 1;
      }
      puVar15[-2] = (byte)uVar9;
      for (uVar9 = iVar13 << 2; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
        puVar15[-1] = (byte)uVar9 | 0x80;
        puVar15 = puVar15 + 1;
      }
      puVar15[-1] = (byte)uVar9;
      data = RepeatedField<float>::data((RepeatedField<float> *)&get_message_from_field);
      target = io::EpsCopyOutputStream::WriteRaw(stream,data,iVar13 << 2,puVar15);
      RepeatedField<float>::~RepeatedField((RepeatedField<float> *)&get_message_from_field);
      goto LAB_00cdd2d2;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&sorted_key_list,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
               ,0x355,"ptr < end_");
    goto LAB_00cdd4bf;
  case '\x03':
    pRVar23 = Reflection::GetRepeatedFieldInternal<long>(this_00,message,field);
    RepeatedField<long>::RepeatedField((RepeatedField<long> *)&get_message_from_field,pRVar23);
    iVar14 = field->number_;
    sVar24 = FieldDataOnlyByteSize(field,message);
    puVar15 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar15);
    if (stream->end_ <= puVar15) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00cdd4bf;
    }
    target = puVar15 + 2;
    for (uVar9 = iVar14 * 8 + 2; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-2] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-2] = (byte)uVar9;
    while( true ) {
      if ((uint)sVar24 < 0x80) break;
      target[-1] = (byte)sVar24 | 0x80;
      sVar24 = (size_t)((uint)sVar24 >> 7);
      target = target + 1;
    }
    target[-1] = (byte)sVar24;
    puVar32 = (ulong *)RepeatedField<long>::data((RepeatedField<long> *)&get_message_from_field);
    iVar14 = RepeatedField<long>::size((RepeatedField<long> *)&get_message_from_field);
    puVar4 = puVar32 + iVar14;
    do {
      pbVar29 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar30 = *puVar32;
      while( true ) {
        target = pbVar29 + 1;
        if (uVar30 < 0x80) break;
        *pbVar29 = (byte)uVar30 | 0x80;
        uVar30 = uVar30 >> 7;
        pbVar29 = target;
      }
      puVar32 = puVar32 + 1;
      *pbVar29 = (byte)uVar30;
    } while (puVar32 < puVar4);
    goto LAB_00cdd163;
  case '\x04':
    pRVar25 = Reflection::GetRepeatedFieldInternal<unsigned_long>(this_00,message,field);
    RepeatedField<unsigned_long>::RepeatedField
              ((RepeatedField<unsigned_long> *)&get_message_from_field,pRVar25);
    iVar14 = field->number_;
    sVar24 = FieldDataOnlyByteSize(field,message);
    puVar15 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar15);
    if (stream->end_ <= puVar15) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00cdd4bf;
    }
    target = puVar15 + 2;
    for (uVar9 = iVar14 * 8 + 2; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-2] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-2] = (byte)uVar9;
    while( true ) {
      if ((uint)sVar24 < 0x80) break;
      target[-1] = (byte)sVar24 | 0x80;
      sVar24 = (size_t)((uint)sVar24 >> 7);
      target = target + 1;
    }
    target[-1] = (byte)sVar24;
    puVar33 = RepeatedField<unsigned_long>::data
                        ((RepeatedField<unsigned_long> *)&get_message_from_field);
    iVar14 = RepeatedField<unsigned_long>::size
                       ((RepeatedField<unsigned_long> *)&get_message_from_field);
    puVar31 = puVar33 + iVar14;
    do {
      pbVar29 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar34 = *puVar33;
      while( true ) {
        target = pbVar29 + 1;
        if (uVar34 < 0x80) break;
        *pbVar29 = (byte)uVar34 | 0x80;
        uVar34 = uVar34 >> 7;
        pbVar29 = target;
      }
      puVar33 = puVar33 + 1;
      *pbVar29 = (byte)uVar34;
    } while (puVar33 < puVar31);
    goto LAB_00cdd235;
  case '\x05':
    pRVar21 = Reflection::GetRepeatedFieldInternal<int>(this_00,message,field);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)&get_message_from_field,pRVar21);
    iVar14 = field->number_;
    sVar24 = FieldDataOnlyByteSize(field,message);
    puVar15 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar15);
    if (stream->end_ <= puVar15) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00cdd4bf;
    }
    target = puVar15 + 2;
    for (uVar9 = iVar14 * 8 + 2; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-2] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-2] = (byte)uVar9;
    while( true ) {
      if ((uint)sVar24 < 0x80) break;
      target[-1] = (byte)sVar24 | 0x80;
      sVar24 = (size_t)((uint)sVar24 >> 7);
      target = target + 1;
    }
    target[-1] = (byte)sVar24;
    piVar26 = RepeatedField<int>::data((RepeatedField<int> *)&get_message_from_field);
    iVar14 = RepeatedField<int>::size((RepeatedField<int> *)&get_message_from_field);
    piVar1 = piVar26 + iVar14;
    do {
      pbVar29 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar30 = (ulong)*piVar26;
      while( true ) {
        target = pbVar29 + 1;
        if (uVar30 < 0x80) break;
        *pbVar29 = (byte)uVar30 | 0x80;
        uVar30 = uVar30 >> 7;
        pbVar29 = target;
      }
      piVar26 = piVar26 + 1;
      *pbVar29 = (byte)uVar30;
    } while (piVar26 < piVar1);
    break;
  case '\x06':
    pRVar25 = Reflection::GetRepeatedFieldInternal<unsigned_long>(this_00,message,field);
    RepeatedField<unsigned_long>::RepeatedField
              ((RepeatedField<unsigned_long> *)&get_message_from_field,pRVar25);
    iVar14 = field->number_;
    puVar15 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar15);
    iVar13 = RepeatedField<unsigned_long>::size
                       ((RepeatedField<unsigned_long> *)&get_message_from_field);
    if (stream->end_ <= puVar15) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00cdd4bf;
    }
    puVar15 = puVar15 + 2;
    for (uVar9 = iVar14 * 8 + 2; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      puVar15[-2] = (byte)uVar9 | 0x80;
      puVar15 = puVar15 + 1;
    }
    puVar15[-2] = (byte)uVar9;
    for (uVar9 = iVar13 << 3; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      puVar15[-1] = (byte)uVar9 | 0x80;
      puVar15 = puVar15 + 1;
    }
    puVar15[-1] = (byte)uVar9;
    puVar31 = RepeatedField<unsigned_long>::data
                        ((RepeatedField<unsigned_long> *)&get_message_from_field);
    target = io::EpsCopyOutputStream::WriteRaw(stream,puVar31,iVar13 << 3,puVar15);
LAB_00cdd235:
    RepeatedField<unsigned_long>::~RepeatedField
              ((RepeatedField<unsigned_long> *)&get_message_from_field);
    goto LAB_00cdd2d2;
  case '\a':
    pRVar22 = Reflection::GetRepeatedFieldInternal<unsigned_int>(this_00,message,field);
    RepeatedField<unsigned_int>::RepeatedField
              ((RepeatedField<unsigned_int> *)&get_message_from_field,pRVar22);
    iVar14 = field->number_;
    puVar15 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar15);
    iVar13 = RepeatedField<unsigned_int>::size
                       ((RepeatedField<unsigned_int> *)&get_message_from_field);
    if (stream->end_ <= puVar15) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00cdd4bf;
    }
    puVar15 = puVar15 + 2;
    for (uVar9 = iVar14 * 8 + 2; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      puVar15[-2] = (byte)uVar9 | 0x80;
      puVar15 = puVar15 + 1;
    }
    puVar15[-2] = (byte)uVar9;
    for (uVar9 = iVar13 << 2; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      puVar15[-1] = (byte)uVar9 | 0x80;
      puVar15 = puVar15 + 1;
    }
    puVar15[-1] = (byte)uVar9;
    puVar27 = RepeatedField<unsigned_int>::data
                        ((RepeatedField<unsigned_int> *)&get_message_from_field);
    target = io::EpsCopyOutputStream::WriteRaw(stream,puVar27,iVar13 << 2,puVar15);
    goto LAB_00cdd2c8;
  case '\b':
    rhs_01 = Reflection::GetRepeatedFieldInternal<bool>(this_00,message,field);
    RepeatedField<bool>::RepeatedField((RepeatedField<bool> *)&get_message_from_field,rhs_01);
    iVar14 = field->number_;
    puVar15 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar15);
    uVar9 = RepeatedField<bool>::size((RepeatedField<bool> *)&get_message_from_field);
    if (puVar15 < stream->end_) {
      puVar15 = puVar15 + 2;
      for (uVar35 = iVar14 * 8 + 2; 0x7f < uVar35; uVar35 = uVar35 >> 7) {
        puVar15[-2] = (byte)uVar35 | 0x80;
        puVar15 = puVar15 + 1;
      }
      puVar15[-2] = (byte)uVar35;
      for (uVar35 = uVar9; 0x7f < uVar35; uVar35 = uVar35 >> 7) {
        puVar15[-1] = (byte)uVar35 | 0x80;
        puVar15 = puVar15 + 1;
      }
      puVar15[-1] = (byte)uVar35;
      data_00 = RepeatedField<bool>::data((RepeatedField<bool> *)&get_message_from_field);
      target = io::EpsCopyOutputStream::WriteRaw(stream,data_00,uVar9,puVar15);
      RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)&get_message_from_field);
      goto LAB_00cdd2d2;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&sorted_key_list,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
               ,0x355,"ptr < end_");
    goto LAB_00cdd4bf;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&sorted_key_list,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x522);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&sorted_key_list,(char (*) [19])"Invalid descriptor");
LAB_00cdd4bf:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&sorted_key_list);
  case '\r':
    pRVar22 = Reflection::GetRepeatedFieldInternal<unsigned_int>(this_00,message,field);
    RepeatedField<unsigned_int>::RepeatedField
              ((RepeatedField<unsigned_int> *)&get_message_from_field,pRVar22);
    iVar14 = field->number_;
    sVar24 = FieldDataOnlyByteSize(field,message);
    puVar15 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar15);
    if (stream->end_ <= puVar15) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00cdd4bf;
    }
    target = puVar15 + 2;
    for (uVar9 = iVar14 * 8 + 2; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-2] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-2] = (byte)uVar9;
    while( true ) {
      if ((uint)sVar24 < 0x80) break;
      target[-1] = (byte)sVar24 | 0x80;
      sVar24 = (size_t)((uint)sVar24 >> 7);
      target = target + 1;
    }
    target[-1] = (byte)sVar24;
    puVar27 = RepeatedField<unsigned_int>::data
                        ((RepeatedField<unsigned_int> *)&get_message_from_field);
    iVar14 = RepeatedField<unsigned_int>::size
                       ((RepeatedField<unsigned_int> *)&get_message_from_field);
    puVar2 = puVar27 + iVar14;
    do {
      pbVar29 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar9 = *puVar27;
      while( true ) {
        target = pbVar29 + 1;
        if (uVar9 < 0x80) break;
        *pbVar29 = (byte)uVar9 | 0x80;
        uVar9 = uVar9 >> 7;
        pbVar29 = target;
      }
      puVar27 = puVar27 + 1;
      *pbVar29 = (byte)uVar9;
    } while (puVar27 < puVar2);
LAB_00cdd2c8:
    RepeatedField<unsigned_int>::~RepeatedField
              ((RepeatedField<unsigned_int> *)&get_message_from_field);
    goto LAB_00cdd2d2;
  case '\x0e':
    pRVar21 = Reflection::GetRepeatedFieldInternal<int>(this_00,message,field);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)&get_message_from_field,pRVar21);
    iVar14 = field->number_;
    sVar24 = FieldDataOnlyByteSize(field,message);
    puVar15 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar15);
    if (stream->end_ <= puVar15) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00cdd4bf;
    }
    target = puVar15 + 2;
    for (uVar9 = iVar14 * 8 + 2; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-2] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-2] = (byte)uVar9;
    while( true ) {
      if ((uint)sVar24 < 0x80) break;
      target[-1] = (byte)sVar24 | 0x80;
      sVar24 = (size_t)((uint)sVar24 >> 7);
      target = target + 1;
    }
    target[-1] = (byte)sVar24;
    piVar26 = RepeatedField<int>::data((RepeatedField<int> *)&get_message_from_field);
    iVar14 = RepeatedField<int>::size((RepeatedField<int> *)&get_message_from_field);
    piVar1 = piVar26 + iVar14;
    do {
      pbVar29 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar30 = (ulong)*piVar26;
      while( true ) {
        target = pbVar29 + 1;
        if (uVar30 < 0x80) break;
        *pbVar29 = (byte)uVar30 | 0x80;
        uVar30 = uVar30 >> 7;
        pbVar29 = target;
      }
      piVar26 = piVar26 + 1;
      *pbVar29 = (byte)uVar30;
    } while (piVar26 < piVar1);
    break;
  case '\x0f':
    pRVar21 = Reflection::GetRepeatedFieldInternal<int>(this_00,message,field);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)&get_message_from_field,pRVar21);
    iVar14 = field->number_;
    puVar15 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar15);
    iVar13 = RepeatedField<int>::size((RepeatedField<int> *)&get_message_from_field);
    if (stream->end_ <= puVar15) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00cdd4bf;
    }
    puVar15 = puVar15 + 2;
    for (uVar9 = iVar14 * 8 + 2; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      puVar15[-2] = (byte)uVar9 | 0x80;
      puVar15 = puVar15 + 1;
    }
    puVar15[-2] = (byte)uVar9;
    for (uVar9 = iVar13 << 2; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      puVar15[-1] = (byte)uVar9 | 0x80;
      puVar15 = puVar15 + 1;
    }
    puVar15[-1] = (byte)uVar9;
    piVar26 = RepeatedField<int>::data((RepeatedField<int> *)&get_message_from_field);
    target = io::EpsCopyOutputStream::WriteRaw(stream,piVar26,iVar13 << 2,puVar15);
    break;
  case '\x10':
    pRVar23 = Reflection::GetRepeatedFieldInternal<long>(this_00,message,field);
    RepeatedField<long>::RepeatedField((RepeatedField<long> *)&get_message_from_field,pRVar23);
    iVar14 = field->number_;
    puVar15 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar15);
    iVar13 = RepeatedField<long>::size((RepeatedField<long> *)&get_message_from_field);
    if (stream->end_ <= puVar15) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00cdd4bf;
    }
    puVar15 = puVar15 + 2;
    for (uVar9 = iVar14 * 8 + 2; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      puVar15[-2] = (byte)uVar9 | 0x80;
      puVar15 = puVar15 + 1;
    }
    puVar15[-2] = (byte)uVar9;
    for (uVar9 = iVar13 << 3; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      puVar15[-1] = (byte)uVar9 | 0x80;
      puVar15 = puVar15 + 1;
    }
    puVar15[-1] = (byte)uVar9;
    plVar28 = RepeatedField<long>::data((RepeatedField<long> *)&get_message_from_field);
    target = io::EpsCopyOutputStream::WriteRaw(stream,plVar28,iVar13 << 3,puVar15);
    goto LAB_00cdd163;
  case '\x11':
    pRVar21 = Reflection::GetRepeatedFieldInternal<int>(this_00,message,field);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)&get_message_from_field,pRVar21);
    iVar14 = field->number_;
    sVar24 = FieldDataOnlyByteSize(field,message);
    puVar15 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar15);
    if (stream->end_ <= puVar15) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00cdd4bf;
    }
    target = puVar15 + 2;
    for (uVar9 = iVar14 * 8 + 2; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-2] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-2] = (byte)uVar9;
    while( true ) {
      if ((uint)sVar24 < 0x80) break;
      target[-1] = (byte)sVar24 | 0x80;
      sVar24 = (size_t)((uint)sVar24 >> 7);
      target = target + 1;
    }
    target[-1] = (byte)sVar24;
    piVar26 = RepeatedField<int>::data((RepeatedField<int> *)&get_message_from_field);
    iVar14 = RepeatedField<int>::size((RepeatedField<int> *)&get_message_from_field);
    piVar1 = piVar26 + iVar14;
    do {
      pbVar29 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar9 = *piVar26 >> 0x1f ^ *piVar26 * 2;
      while( true ) {
        target = pbVar29 + 1;
        if (uVar9 < 0x80) break;
        *pbVar29 = (byte)uVar9 | 0x80;
        uVar9 = uVar9 >> 7;
        pbVar29 = target;
      }
      piVar26 = piVar26 + 1;
      *pbVar29 = (byte)uVar9;
    } while (piVar26 < piVar1);
    break;
  case '\x12':
    pRVar23 = Reflection::GetRepeatedFieldInternal<long>(this_00,message,field);
    RepeatedField<long>::RepeatedField((RepeatedField<long> *)&get_message_from_field,pRVar23);
    iVar14 = field->number_;
    sVar24 = FieldDataOnlyByteSize(field,message);
    puVar15 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar15);
    if (stream->end_ <= puVar15) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sorted_key_list,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00cdd4bf;
    }
    target = puVar15 + 2;
    for (uVar9 = iVar14 * 8 + 2; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-2] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-2] = (byte)uVar9;
    while( true ) {
      if ((uint)sVar24 < 0x80) break;
      target[-1] = (byte)sVar24 | 0x80;
      sVar24 = (size_t)((uint)sVar24 >> 7);
      target = target + 1;
    }
    target[-1] = (byte)sVar24;
    plVar28 = RepeatedField<long>::data((RepeatedField<long> *)&get_message_from_field);
    iVar14 = RepeatedField<long>::size((RepeatedField<long> *)&get_message_from_field);
    plVar3 = plVar28 + iVar14;
    do {
      pbVar29 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar30 = *plVar28 >> 0x3f ^ *plVar28 * 2;
      while( true ) {
        target = pbVar29 + 1;
        if (uVar30 < 0x80) break;
        *pbVar29 = (byte)uVar30 | 0x80;
        uVar30 = uVar30 >> 7;
        pbVar29 = target;
      }
      plVar28 = plVar28 + 1;
      *pbVar29 = (byte)uVar30;
    } while (plVar28 < plVar3);
LAB_00cdd163:
    RepeatedField<long>::~RepeatedField((RepeatedField<long> *)&get_message_from_field);
    goto LAB_00cdd2d2;
  }
  RepeatedField<int>::~RepeatedField((RepeatedField<int> *)&get_message_from_field);
LAB_00cdd2d2:
  std::
  _Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::~_Vector_base(&map_entries.
                   super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                 );
  return target;
}

Assistant:

uint8_t* WireFormat::InternalSerializeField(const FieldDescriptor* field,
                                            const Message& message,
                                            uint8_t* target,
                                            io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    return InternalSerializeMessageSetItem(field, message, target, stream);
  }


  // For map fields, we can use either repeated field reflection or map
  // reflection.  Our choice has some subtle effects.  If we use repeated field
  // reflection here, then the repeated field representation becomes
  // authoritative for this field: any existing references that came from map
  // reflection remain valid for reading, but mutations to them are lost and
  // will be overwritten next time we call map reflection!
  //
  // So far this mainly affects Python, which keeps long-term references to map
  // values around, and always uses map reflection.  See: b/35918691
  //
  // Here we choose to use map reflection API as long as the internal
  // map is valid. In this way, the serialization doesn't change map field's
  // internal state and existing references that came from map reflection remain
  // valid for both reading and writing.
  if (field->is_map()) {
    const MapFieldBase* map_field =
        message_reflection->GetMapData(message, field);
    if (map_field->IsMapValid()) {
      if (stream->IsSerializationDeterministic()) {
        std::vector<MapKey> sorted_key_list =
            MapKeySorter::SortKey(message, message_reflection, field);
        for (std::vector<MapKey>::iterator it = sorted_key_list.begin();
             it != sorted_key_list.end(); ++it) {
          MapValueConstRef map_value;
          message_reflection->LookupMapValue(message, field, *it, &map_value);
          target =
              InternalSerializeMapEntry(field, *it, map_value, target, stream);
        }
      } else {
        for (MapIterator it = message_reflection->MapBegin(
                 const_cast<Message*>(&message), field);
             it !=
             message_reflection->MapEnd(const_cast<Message*>(&message), field);
             ++it) {
          target = InternalSerializeMapEntry(field, it.GetKey(),
                                             it.GetValueRef(), target, stream);
        }
      }

      return target;
    }
  }
  int count = 0;

  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  // map_entries is for maps that'll be deterministically serialized.
  std::vector<const Message*> map_entries;
  if (count > 1 && field->is_map() && stream->IsSerializationDeterministic()) {
    map_entries =
        DynamicMapSorter::Sort(message, count, message_reflection, field);
  }

  if (field->is_packed()) {
    if (count == 0) return target;
    target = stream->EnsureSpace(target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    auto r =                                                                   \
        message_reflection->GetRepeatedFieldInternal<CPPTYPE>(message, field); \
    target = stream->Write##TYPE_METHOD##Packed(                               \
        field->number(), r, FieldDataOnlyByteSize(field, message), target);    \
    break;                                                                     \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32_t, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64_t, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32_t, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64_t, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t, UInt64, UInt64)
      HANDLE_PRIMITIVE_TYPE(ENUM, int, Enum, Enum)

#undef HANDLE_PRIMITIVE_TYPE
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    auto r =                                                                   \
        message_reflection->GetRepeatedFieldInternal<CPPTYPE>(message, field); \
    target = stream->WriteFixedPacked(field->number(), r, target);             \
    break;                                                                     \
  }

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32_t, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64_t, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32_t, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64_t, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE
      default:
        ABSL_LOG(FATAL) << "Invalid descriptor";
    }
    return target;
  }

  auto get_message_from_field = [&message, &map_entries, message_reflection](
                                    const FieldDescriptor* field, int j) {
    if (!field->is_repeated()) {
      return &message_reflection->GetMessage(message, field);
    }
    if (!map_entries.empty()) {
      return map_entries[j];
    }
    return &message_reflection->GetRepeatedMessage(message, field, j);
  };
  for (int j = 0; j < count; j++) {
    target = stream->EnsureSpace(target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)     \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    const CPPTYPE value =                                                     \
        field->is_repeated()                                                  \
            ? message_reflection->GetRepeated##CPPTYPE_METHOD(message, field, \
                                                              j)              \
            : message_reflection->Get##CPPTYPE_METHOD(message, field);        \
    target = WireFormatLite::Write##TYPE_METHOD##ToArray(field->number(),     \
                                                         value, target);      \
    break;                                                                    \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32_t, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64_t, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32_t, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64_t, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t, UInt64, UInt64)

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32_t, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64_t, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32_t, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64_t, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE

      case FieldDescriptor::TYPE_GROUP: {
        auto* msg = get_message_from_field(field, j);
        target = WireFormatLite::InternalWriteGroup(field->number(), *msg,
                                                    target, stream);
      } break;

      case FieldDescriptor::TYPE_MESSAGE: {
        auto* msg = get_message_from_field(field, j);
        target = WireFormatLite::InternalWriteMessage(
            field->number(), *msg, msg->GetCachedSize(), target, stream);
      } break;

      case FieldDescriptor::TYPE_ENUM: {
        const EnumValueDescriptor* value =
            field->is_repeated()
                ? message_reflection->GetRepeatedEnum(message, field, j)
                : message_reflection->GetEnum(message, field);
        target = WireFormatLite::WriteEnumToArray(field->number(),
                                                  value->number(), target);
        break;
      }

      // Handle strings separately so that we can get string references
      // instead of copying.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = field->requires_utf8_validation();
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        if (strict_utf8_check) {
          WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                           WireFormatLite::SERIALIZE,
                                           field->full_name());
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), SERIALIZE,
                                     field->full_name());
        }
        target = stream->WriteString(field->number(), value, target);
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
          absl::Cord value = message_reflection->GetCord(message, field);
          target = stream->WriteString(field->number(), value, target);
          break;
        }
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        target = stream->WriteString(field->number(), value, target);
        break;
      }
    }
  }
  return target;
}